

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Geometry<std::allocator<unsigned_long>_> * __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
          (Geometry<std::allocator<unsigned_long>_> *this,
          Geometry<std::allocator<unsigned_long>_> *g)

{
  unsigned_long *__dest;
  size_t sVar1;
  
  if (g != this) {
    sVar1 = g->dimension_;
    __dest = this->shape_;
    if (sVar1 != this->dimension_) {
      operator_delete(__dest,this->dimension_ * 0x18);
      sVar1 = g->dimension_;
      this->dimension_ = sVar1;
      __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)this,sVar1 * 3,(void *)0x0);
      this->shape_ = __dest;
      this->shapeStrides_ = __dest + this->dimension_;
      this->strides_ = __dest + this->dimension_ + this->dimension_;
      sVar1 = g->dimension_;
      this->dimension_ = sVar1;
    }
    memcpy(__dest,g->shape_,sVar1 * 0x18);
    this->size_ = g->size_;
    this->coordinateOrder_ = g->coordinateOrder_;
    this->isSimple_ = g->isSimple_;
  }
  return this;
}

Assistant:

inline Geometry<A>& 
Geometry<A>::operator=
(
    const Geometry<A>& g
)
{
    if(&g != this) { // no self-assignment
        if(g.dimension_ != dimension_) {
            allocator_.deallocate(shape_, dimension_*3);
            dimension_ = g.dimension_;
            shape_ = allocator_.allocate(dimension_*3);
            shapeStrides_ = shape_+dimension_;
            strides_ = shapeStrides_+dimension_;
            dimension_ = g.dimension_;
        }
        /*
        for(std::size_t j=0; j<dimension_; ++j) {
            shape_[j] = g.shape_[j];
            shapeStrides_[j] = g.shapeStrides_[j];
            strides_[j] = g.strides_[j];
        }
        */
        memcpy(shape_, g.shape_, (dimension_*3)*sizeof(std::size_t));
        size_ = g.size_;
        coordinateOrder_ = g.coordinateOrder_;
        isSimple_ = g.isSimple_;
    }
    return *this;
}